

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

AMQP_VALUE messaging_create_source(char *address)

{
  int iVar1;
  SOURCE_HANDLE source;
  AMQP_VALUE address_value;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  char *pcVar4;
  
  source = source_create();
  if (source == (SOURCE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_create_source",0x12,1,"NULL source");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  address_value = amqpvalue_create_string(address);
  if (address_value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar3 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_create_source",0x1a,1,"Cannot create address AMQP string");
    }
    goto LAB_0016e37e;
  }
  iVar1 = source_set_address(source,address_value);
  if (iVar1 == 0) {
    pAVar3 = amqpvalue_create_source(source);
    if (pAVar3 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0016e373;
      pcVar4 = "Cannot create source";
      iVar1 = 0x29;
      goto LAB_0016e2a0;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
LAB_0016e373:
      pAVar3 = (AMQP_VALUE)0x0;
    }
    else {
      pcVar4 = "Cannot set address on source";
      iVar1 = 0x21;
LAB_0016e2a0:
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_create_source",iVar1,1,pcVar4);
    }
  }
  amqpvalue_destroy(address_value);
LAB_0016e37e:
  source_destroy(source);
  return pAVar3;
}

Assistant:

AMQP_VALUE messaging_create_source(const char* address)
{
    AMQP_VALUE result;
    SOURCE_HANDLE source = source_create();

    if (source == NULL)
    {
        LogError("NULL source");
        result = NULL;
    }
    else
    {
        AMQP_VALUE address_value = amqpvalue_create_string(address);
        if (address_value == NULL)
        {
            LogError("Cannot create address AMQP string");
            result = NULL;
        }
        else
        {
            if (source_set_address(source, address_value) != 0)
            {
                LogError("Cannot set address on source");
                result = NULL;
            }
            else
            {
                result = amqpvalue_create_source(source);
                if (result == NULL)
                {
                    LogError("Cannot create source");
                }
                else
                {
                    /* all ok */
                }
            }

            amqpvalue_destroy(address_value);
        }

        source_destroy(source);
    }

    return result;
}